

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_compile_regexp(JSContext *ctx,JSValue pattern,JSValue flags)

{
  uint uVar1;
  char *pcVar2;
  uint8_t *buf;
  ulong uVar3;
  size_t sVar5;
  uint uVar6;
  uint re_flags;
  ulong uVar7;
  JSValue JVar8;
  size_t len;
  int re_bytecode_len;
  char error_msg [64];
  int64_t iVar4;
  
  re_flags = 0;
  iVar4 = 6;
  if ((int)flags.tag == 3) {
LAB_00127fe9:
    pcVar2 = JS_ToCStringLen2(ctx,&len,pattern,(uint)((re_flags & 0x10) == 0));
    if (pcVar2 != (char *)0x0) {
      buf = lre_compile(&re_bytecode_len,error_msg,0x40,pcVar2,len,re_flags,ctx);
      JS_FreeCString(ctx,pcVar2);
      if (buf != (uint8_t *)0x0) {
        JVar8 = js_new_string8(ctx,buf,re_bytecode_len);
        iVar4 = JVar8.tag;
        (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,buf);
        uVar3 = (ulong)JVar8.u.ptr & 0xffffffff00000000;
        uVar7 = (ulong)JVar8.u.ptr & 0xffffffff;
        goto LAB_0012812b;
      }
      JS_ThrowSyntaxError(ctx,"%s",error_msg);
    }
  }
  else {
    pcVar2 = JS_ToCStringLen(ctx,&len,flags);
    re_flags = 0;
    if (pcVar2 != (char *)0x0) {
      for (sVar5 = 0; len != sVar5; sVar5 = sVar5 + 1) {
        uVar1 = (byte)pcVar2[sVar5] - 0x67 >> 1;
        uVar6 = uVar1 | (uint)(((byte)pcVar2[sVar5] - 0x67 & 1) != 0) << 0x1f;
        if (((9 < uVar6) || ((0x2cbU >> (uVar1 & 0x1f) & 1) == 0)) ||
           ((*(uint *)(&DAT_00168c48 + (ulong)uVar6 * 4) & re_flags) != 0)) {
          JS_FreeCString(ctx,pcVar2);
          JS_ThrowSyntaxError(ctx,"invalid regular expression flags");
          goto LAB_00128129;
        }
        re_flags = re_flags | *(uint *)(&DAT_00168c48 + (ulong)uVar6 * 4);
      }
      JS_FreeCString(ctx,pcVar2);
      goto LAB_00127fe9;
    }
  }
LAB_00128129:
  uVar7 = 0;
  uVar3 = 0;
LAB_0012812b:
  JVar8.tag = iVar4;
  JVar8.u.ptr = (void *)(uVar7 | uVar3);
  return JVar8;
}

Assistant:

static JSValue js_compile_regexp(JSContext *ctx, JSValueConst pattern,
                                 JSValueConst flags)
{
    const char *str;
    int re_flags, mask;
    uint8_t *re_bytecode_buf;
    size_t i, len;
    int re_bytecode_len;
    JSValue ret;
    char error_msg[64];

    re_flags = 0;
    if (!JS_IsUndefined(flags)) {
        str = JS_ToCStringLen(ctx, &len, flags);
        if (!str)
            return JS_EXCEPTION;
        /* XXX: re_flags = LRE_FLAG_OCTAL unless strict mode? */
        for (i = 0; i < len; i++) {
            switch(str[i]) {
            case 'g':
                mask = LRE_FLAG_GLOBAL;
                break;
            case 'i':
                mask = LRE_FLAG_IGNORECASE;
                break;
            case 'm':
                mask = LRE_FLAG_MULTILINE;
                break;
            case 's':
                mask = LRE_FLAG_DOTALL;
                break;
            case 'u':
                mask = LRE_FLAG_UTF16;
                break;
            case 'y':
                mask = LRE_FLAG_STICKY;
                break;
            default:
                goto bad_flags;
            }
            if ((re_flags & mask) != 0) {
            bad_flags:
                JS_FreeCString(ctx, str);
                return JS_ThrowSyntaxError(ctx, "invalid regular expression flags");
            }
            re_flags |= mask;
        }
        JS_FreeCString(ctx, str);
    }

    str = JS_ToCStringLen2(ctx, &len, pattern, !(re_flags & LRE_FLAG_UTF16));
    if (!str)
        return JS_EXCEPTION;
    re_bytecode_buf = lre_compile(&re_bytecode_len, error_msg,
                                  sizeof(error_msg), str, len, re_flags, ctx);
    JS_FreeCString(ctx, str);
    if (!re_bytecode_buf) {
        JS_ThrowSyntaxError(ctx, "%s", error_msg);
        return JS_EXCEPTION;
    }

    ret = js_new_string8(ctx, re_bytecode_buf, re_bytecode_len);
    js_free(ctx, re_bytecode_buf);
    return ret;
}